

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferObjectQueryTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::anon_unknown_2::BufferCase::test(BufferCase *this)

{
  CallLogWrapper *this_00;
  ulong in_RAX;
  long lVar1;
  ulong uStack_38;
  GLuint bufferId;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  uStack_38 = in_RAX;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 4) {
    this->m_bufferTarget = *(GLenum *)((long)BufferWriteTests::init::bufferTargets + lVar1);
    uStack_38 = uStack_38 & 0xffffffff;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&bufferId);
    glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,bufferId);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&bufferId);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		const GLenum bufferTargets[] =
		{
			GL_ARRAY_BUFFER, GL_ELEMENT_ARRAY_BUFFER
		};
		const int targets = DE_LENGTH_OF_ARRAY(bufferTargets);

		for (int ndx = 0; ndx < targets; ++ndx)
		{
			m_bufferTarget = bufferTargets[ndx];

			GLuint bufferId = 0;
			glGenBuffers(1, &bufferId);
			glBindBuffer(m_bufferTarget, bufferId);
			expectError(GL_NO_ERROR);

			testBuffer();

			glDeleteBuffers(1, &bufferId);
			expectError(GL_NO_ERROR);
		}
	}